

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
kratos::extract_interface_info_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,kratos *this,Generator *top)

{
  _Rb_tree_header *p_Var1;
  undefined1 *puVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type eVar4;
  char cVar5;
  int iVar6;
  size_type sVar7;
  SystemVerilogCodeGen *this_01;
  ostream *poVar8;
  _Base_ptr p_Var9;
  Var *this_02;
  _Rb_tree_node_base *p_Var10;
  UserException *this_03;
  Port *port;
  Var *var;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  uint uVar11;
  undefined1 *puVar12;
  InterfaceRef *pIVar13;
  ulong uVar14;
  string_view format_str;
  format_args args;
  stringstream local_340 [8];
  stringstream stream;
  undefined1 local_1a8 [8];
  InterfaceVisitor visitor;
  undefined1 local_d8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  size_type *local_a0;
  string indent;
  undefined1 local_70 [40];
  ulong local_48;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_40;
  InterfaceRef *local_38;
  
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  port_names._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&PTR_visit_root_002adeb8;
  local_1a8 = (undefined1  [8])&PTR_visit_root_002adeb8;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
       (__node_base_ptr)&visitor.interfaces_._M_h._M_rehash_policy._M_next_resize;
  visitor.interfaces_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.interfaces_._M_h._M_bucket_count = 0;
  visitor.interfaces_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.interfaces_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.interfaces_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.interfaces_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.interfaces_._M_h._M_rehash_policy._M_next_resize = 0;
  visitor.interfaces_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  visitor.lock_.super___mutex_base._M_mutex.__align = 0;
  visitor.lock_.super___mutex_base._M_mutex._8_8_ = 0;
  visitor.lock_.super___mutex_base._M_mutex._16_8_ = 0;
  visitor.lock_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  IRVisitor::visit_generator_root_p((IRVisitor *)local_1a8,(Generator *)this);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0 = &indent._M_string_length;
  local_40 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)__return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"  ","");
  if (visitor.interfaces_._M_h._M_bucket_count != 0) {
    puVar2 = &stream.field_0x8;
    sVar7 = visitor.interfaces_._M_h._M_bucket_count;
    do {
      pIVar13 = *(InterfaceRef **)(sVar7 + 0x30);
      indent.field_2._8_8_ = sVar7;
      iVar6 = (*((pIVar13->definition_).
                 super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_IDefinition[8])();
      if ((char)iVar6 == '\0') {
        std::__cxx11::stringstream::stringstream(local_340);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,"interface ",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)puVar2,*(char **)(indent.field_2._8_8_ + 8),
                   *(long *)(indent.field_2._8_8_ + 0x10));
        local_38 = pIVar13;
        (*((pIVar13->definition_).
           super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_IDefinition[4])
                  ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_d8);
        p_Var9 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_d8);
        cVar5 = (char)puVar2;
        if (p_Var9 == (_Base_ptr)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,";",1);
          pIVar13 = local_38;
          std::ios::widen((char)*(undefined8 *)(stream._8_8_ + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,"(",1);
          pIVar13 = local_38;
          std::ios::widen((char)*(undefined8 *)(stream._8_8_ + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
          (*((pIVar13->definition_).
             super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_IDefinition[4])(local_d8);
          if (port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
              (_Base_ptr)&port_names) {
            puVar12 = (undefined1 *)0x0;
            p_Var9 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              this_01 = (SystemVerilogCodeGen *)InterfaceRef::port(local_38,(string *)(p_Var9 + 1));
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)puVar2,(char *)local_a0,(long)indent._M_dataplus._M_p);
              SystemVerilogCodeGen::get_port_str_abi_cxx11_((string *)local_70,this_01,port);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,(char *)local_70._0_8_,local_70._8_8_);
              if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
                operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
              }
              if ((undefined1 *)
                  ((long)&port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right[-1].
                          _M_right + 7U) != puVar12) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,",",1);
              }
              std::ios::widen((char)*(undefined8 *)(stream._8_8_ + -0x18) + cVar5);
              std::ostream::put(cVar5);
              std::ostream::flush();
              p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
              puVar12 = (undefined1 *)(ulong)((int)puVar12 + 1);
            } while (p_Var9 != (_Rb_tree_node_base *)&port_names);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,");",2);
          std::ios::widen((char)*(undefined8 *)(stream._8_8_ + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_d8);
          pIVar13 = local_38;
        }
        (*((pIVar13->definition_).
           super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_IDefinition[5])(local_d8);
        for (p_Var9 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var9 != (_Rb_tree_node_base *)&port_names;
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
          this_02 = InterfaceRef::var(pIVar13,(string *)(p_Var9 + 1));
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)puVar2,(char *)local_a0,(long)indent._M_dataplus._M_p);
          Stream::get_var_decl_abi_cxx11_((string *)local_70,(Stream *)this_02,var);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(char *)local_70._0_8_,local_70._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,";",1);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
            operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
          }
        }
        peVar3 = (pIVar13->definition_).
                 super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        this_00 = (pIVar13->definition_).
                  super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        for (local_38 = (InterfaceRef *)peVar3[0x16]._vptr_IDefinition;
            local_38 != (InterfaceRef *)(peVar3 + 0x14);
            local_38 = (InterfaceRef *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_38)) {
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)puVar2,(char *)local_a0,(long)indent._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"modport ",8);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(char *)*(_func_int ***)((long)local_38 + 0x20),
                              (long)((_Rb_tree_node_base *)((long)local_38 + 0x20))->_M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(",1);
          (**(code **)(**(_func_int ***)((long)local_38 + 0x40) + 0x20))(local_70);
          if (local_48 == 0) {
            this_03 = (UserException *)__cxa_allocate_exception(0x10);
            stream._384_8_ = *(undefined8 *)((long)local_38 + 0x20);
            format_str.size_ = 0xd;
            format_str.data_ = (char *)0xc;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&stream.field_0x180;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)&visitor.lock_.super___mutex_base._M_mutex.__data.__list.__next,
                       (detail *)0x245d76,format_str,args);
            UserException::UserException
                      (this_03,(string *)
                               &visitor.lock_.super___mutex_base._M_mutex.__data.__list.__next);
            __cxa_throw(this_03,&UserException::typeinfo,std::runtime_error::~runtime_error);
          }
          eVar4._vptr_IDefinition = *(_func_int ***)((long)local_38 + 0x40);
          uVar14 = 0;
          uVar11 = 0;
          for (p_Var10 = (_Rb_tree_node_base *)eVar4._vptr_IDefinition[10];
              p_Var10 != (_Rb_tree_node_base *)(eVar4._vptr_IDefinition + 8);
              p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,"input ",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)puVar2,*(char **)(p_Var10 + 1),(long)p_Var10[1]._M_parent);
            uVar11 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar11;
            if (local_48 != uVar14) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,", ",2);
            }
          }
          for (p_Var10 = (_Rb_tree_node_base *)eVar4._vptr_IDefinition[0x10];
              p_Var10 != (_Rb_tree_node_base *)(eVar4._vptr_IDefinition + 0xe);
              p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
            uVar11 = uVar11 + 1;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,"output ",7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)puVar2,*(char **)(p_Var10 + 1),(long)p_Var10[1]._M_parent);
            if (local_48 != uVar11) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,", ",2);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,");",2);
          std::ios::widen((char)*(undefined8 *)(stream._8_8_ + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_70);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,"endinterface",0xc);
        std::ios::widen((char)*(undefined8 *)(stream._8_8_ + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string>
                  (local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (indent.field_2._8_8_ + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
        if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
          operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_d8);
        std::__cxx11::stringstream::~stringstream(local_340);
        std::ios_base::~ios_base((ios_base *)&stream.field_0x78);
      }
      sVar7 = *(size_type *)indent.field_2._8_8_;
    } while (sVar7 != 0);
  }
  if (local_a0 != &indent._M_string_length) {
    operator_delete(local_a0,indent._M_string_length + 1);
  }
  local_1a8 = (undefined1  [8])port_names._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  local_1a8 = (undefined1  [8])&PTR_visit_root_002a82e0;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&visitor.super_IRVisitor.level);
  return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_40;
}

Assistant:

std::map<std::string, std::string> extract_interface_info(Generator* top) {
    InterfaceVisitor visitor;
    visitor.visit_generator_root_p(top);
    auto const& defs = visitor.interfaces();
    std::map<std::string, std::string> result;
    const std::string indent = "  ";
    for (auto const& [interface_name, def] : defs) {
        const auto* i_ref = def.second;
        auto const& i_def = i_ref->definition();
        if (i_def->is_modport())
            // don't generate mod port definition
            continue;
        std::stringstream stream;
        stream << "interface " << interface_name;
        if (!i_def->ports().empty()) {
            stream << "(" << std::endl;
            auto port_names = i_def->ports();
            uint32_t i = 0;
            for (auto const& port_name : port_names) {
                auto* p = &i_ref->port(port_name);
                stream << indent << SystemVerilogCodeGen::get_port_str(p);
                if (i++ == port_names.size() - 1)
                    stream << std::endl;
                else
                    stream << "," << std::endl;
            }
            stream << ");" << std::endl;
        } else {
            stream << ";" << std::endl;
        }
        // output vars
        auto const& vars = i_def->vars();
        for (auto const& var_name : vars) {
            auto* v = &i_ref->var(var_name);
            stream << indent << Stream::get_var_decl(v) << ";" << std::endl;
        }

        // modports
        auto interface_definition = std::static_pointer_cast<InterfaceDefinition>(i_def);
        auto const& mod_ports = interface_definition->mod_ports();
        for (auto const& [mod_name, mod_port] : mod_ports) {
            stream << indent << "modport " << mod_name << "(";
            auto const& ports = mod_port->ports();
            if (ports.empty()) throw UserException(::format("{0} is empty", mod_name));
            auto const& inputs = mod_port->inputs();
            auto const& outputs = mod_port->outputs();
            uint32_t count = 0;
            for (auto const& name : inputs) {
                stream << "input " << name;
                if (++count != ports.size()) stream << ", ";
            }
            for (auto const& name : outputs) {
                stream << "output " << name;
                if (++count != ports.size()) stream << ", ";
            }
            stream << ");" << std::endl;
        }
        stream << "endinterface" << std::endl;
        result.emplace(interface_name, stream.str());
    }
    return result;
}